

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O2

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::~rasterizer_cells_aa
          (rasterizer_cells_aa<agg::cell_aa> *this)

{
  ulong uVar1;
  cell_type **ppcVar2;
  
  uVar1 = (ulong)this->m_num_blocks;
  if (uVar1 != 0) {
    ppcVar2 = this->m_cells + uVar1;
    while( true ) {
      ppcVar2 = ppcVar2 + -1;
      this->m_num_blocks = (int)uVar1 - 1;
      if ((int)uVar1 == 0) break;
      pod_allocator<agg::cell_aa>::deallocate(*ppcVar2,0x1000);
      uVar1 = (ulong)this->m_num_blocks;
    }
    pod_allocator<agg::cell_aa_*>::deallocate(this->m_cells,this->m_max_blocks);
  }
  pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::~pod_vector(&this->m_sorted_y);
  pod_vector<agg::cell_aa_*>::~pod_vector(&this->m_sorted_cells);
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::~rasterizer_cells_aa()
    {
        if(m_num_blocks)
        {
            cell_type** ptr = m_cells + m_num_blocks - 1;
            while(m_num_blocks--)
            {
                pod_allocator<cell_type>::deallocate(*ptr, cell_block_size);
                ptr--;
            }
            pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
        }
    }